

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O1

uint32_t mpr_calculate_d_of_y_s
                   (nhdp_domain *domain,neighbor_graph *graph,addr_node *y,avl_tree *subset_s)

{
  oonf_log_source oVar1;
  uint32_t uVar2;
  char *pcVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  ulong uVar6;
  netaddr_str buf1;
  
  uVar2 = (*graph->methods->calculate_d1_x_of_n2_addr)(domain,graph,y);
  oVar1 = LOG_MPR;
  uVar6 = 0xffffffff;
  if (uVar2 < 0xffff01) {
    uVar6 = (ulong)uVar2;
  }
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    pcVar3 = netaddr_to_prefixstring(&buf1,&y->addr,false);
    oonf_log(LOG_SEVERITY_DEBUG,oVar1,"src/nhdp/mpr/neighbor-graph.c",0x121,(void *)0x0,0,
             "mpr_calculate_d_of_y_s(%s)",pcVar3);
  }
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x122,(void *)0x0,0,
             "initial cost = %u",uVar6);
  }
  plVar5 = (subset_s->list_head).next;
  plVar4 = plVar5->prev;
  while (plVar4 != (subset_s->list_head).prev) {
    uVar2 = (*graph->methods->calculate_d_x_y)(domain,graph,(n1_node *)&plVar5[-3].prev,y);
    oVar1 = LOG_MPR;
    if ((log_global_mask[LOG_MPR] & 1) != 0) {
      pcVar3 = netaddr_to_prefixstring(&buf1,(netaddr *)&plVar5[-3].prev,false);
      oonf_log(LOG_SEVERITY_DEBUG,oVar1,"src/nhdp/mpr/neighbor-graph.c",0x125,(void *)0x0,0,
               "cost via %s would be = %u",pcVar3,(ulong)uVar2);
    }
    if (uVar2 < (uint)uVar6) {
      uVar6 = (ulong)uVar2;
    }
    plVar5 = plVar5->next;
    plVar4 = plVar5->prev;
  }
  return (uint)uVar6;
}

Assistant:

uint32_t
mpr_calculate_d_of_y_s(
  const struct nhdp_domain *domain, struct neighbor_graph *graph, struct addr_node *y, struct avl_tree *subset_s) {
  uint32_t d_x_y, min_cost;
  struct n1_node *node_n1;

#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf1;
#endif

  /* determine the minimum cost to y over all possible intermediate hops */
  min_cost = graph->methods->calculate_d1_x_of_n2_addr(domain, graph, y);
  if (min_cost > RFC7181_METRIC_MAX) {
    min_cost = RFC7181_METRIC_INFINITE_PATH;
  }
  OONF_DEBUG(LOG_MPR, "mpr_calculate_d_of_y_s(%s)", netaddr_to_string(&buf1, &y->addr));
  OONF_DEBUG(LOG_MPR, "initial cost = %u", min_cost);
  avl_for_each_element(subset_s, node_n1, _avl_node) {
    d_x_y = graph->methods->calculate_d_x_y(domain, graph, node_n1, y);
    OONF_DEBUG(LOG_MPR, "cost via %s would be = %u", netaddr_to_string(&buf1, &node_n1->addr), d_x_y);
    if (d_x_y < min_cost) {
      min_cost = d_x_y;
    }
  }

  return min_cost;
}